

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O3

void __thiscall Fl_Scroll::bbox(Fl_Scroll *this,int *X,int *Y,int *W,int *H)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar2 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  *X = iVar2 + iVar1;
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar2 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  *Y = iVar2 + iVar1;
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar2 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  *W = iVar1 - iVar2;
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar2 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  *H = iVar1 - iVar2;
  if ((((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) &&
     (*W = *W - (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.w_,
     ((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 4) != 0))
  {
    *X = *X + (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.w_;
  }
  if ((((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) &&
     (*H = *H - (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.h_,
     ((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 1) != 0))
  {
    *Y = *Y + (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.h_;
  }
  return;
}

Assistant:

void Fl_Scroll::bbox(int& X, int& Y, int& W, int& H) {
  X = x()+Fl::box_dx(box());
  Y = y()+Fl::box_dy(box());
  W = w()-Fl::box_dw(box());
  H = h()-Fl::box_dh(box());
  if (scrollbar.visible()) {
    W -= scrollbar.w();
    if (scrollbar.align() & FL_ALIGN_LEFT) X += scrollbar.w();
  }
  if (hscrollbar.visible()) {
    H -= hscrollbar.h();
    if (scrollbar.align() & FL_ALIGN_TOP) Y += hscrollbar.h();
  }
}